

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

Inversion * __thiscall
OpenMD::SelectionManager::beginUnselectedInversion(SelectionManager *this,int *i)

{
  pointer pOVar1;
  int iVar2;
  Inversion *pIVar3;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0;
  if ((**(byte **)&pOVar1[4].bitset_.super__Bvector_base<std::allocator<bool>_> & 1) != 0) {
    iVar2 = OpenMDBitSet::nextOffBit(pOVar1 + 4,0);
  }
  *i = iVar2;
  if (iVar2 == -1) {
    pIVar3 = (Inversion *)0x0;
  }
  else {
    pIVar3 = (this->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2];
  }
  return pIVar3;
}

Assistant:

Inversion* SelectionManager::beginUnselectedInversion(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[INVERSION].size())) {
      if (!ss_.bitsets_[INVERSION][i]) {
        // check that this processor owns this inversion
        if (inversions_[i] != NULL) return inversions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[INVERSION].firstOffBit();
    return i == -1 ? NULL : inversions_[i];
#endif
  }